

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

bool CommandDrawSwitchableImage::EvaluateOperation(Operator *op,int *value,int *compare)

{
  int *compare_local;
  int *value_local;
  Operator *op_local;
  
  switch(*op) {
  case EQUAL:
    op_local._7_1_ = *compare == *value;
    break;
  case LESS:
    op_local._7_1_ = *compare < *value;
    break;
  case GREATER:
  default:
    op_local._7_1_ = *value < *compare;
    break;
  case LESSOREQUAL:
    op_local._7_1_ = *compare <= *value;
    break;
  case GREATEROREQUAL:
    op_local._7_1_ = *value <= *compare;
    break;
  case NOTEQUAL:
    op_local._7_1_ = *compare != *value;
  }
  return op_local._7_1_;
}

Assistant:

static bool	EvaluateOperation(const Operator &op, const int &value, const int &compare)
		{
			switch(op)
			{
				case EQUAL:
					return compare == value;
				case LESS:
					return compare < value;
				case GREATER:
				default:
					return compare > value;
				case LESSOREQUAL:
					return compare <= value;
				case GREATEROREQUAL:
					return compare >= value;
				case NOTEQUAL:
					return compare != value;
			}
		}